

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_cfilter_remove(Curl_easy *data,int sockindex,_Bool send_shutdown)

{
  curl_trc_feat *pcVar1;
  void *pvVar2;
  byte bVar3;
  CURLcode CVar4;
  int iVar5;
  timediff_t timeout_ms;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  Curl_cfilter *cf;
  Curl_cfilter *cf_00;
  _Bool done;
  int local_4c;
  Curl_cfilter *local_48;
  uint local_3c;
  undefined8 local_38;
  
  if (data->conn == (connectdata *)0x0) {
    cf = (Curl_cfilter *)0x0;
    cf_00 = cf;
  }
  else {
    cf = data->conn->cfilter[sockindex];
    cf_00 = cf;
  }
  while( true ) {
    if (cf == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    if (cf->cft == &Curl_cft_ssl) break;
    cf = cf->next;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_cft_ssl.log_level)) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, start");
  }
  CVar4 = CURLE_OK;
  Curl_shutdown_start(data,sockindex,(curltime *)0x0);
  if ((cf->field_0x24 & 2) == 0) {
    pvVar2 = cf->ctx;
    local_38 = *(undefined8 *)((long)pvVar2 + 0x38);
    *(Curl_easy **)((long)pvVar2 + 0x38) = data;
    done = false;
    local_3c = (uint)send_shutdown;
    local_4c = sockindex;
    local_48 = cf_00;
    for (iVar8 = -10; ((done & 1U) == 0 && (iVar8 != 0)); iVar8 = iVar8 + 1) {
      timeout_ms = Curl_shutdown_timeleft(cf->conn,cf->sockindex,(curltime *)0x0);
      if (timeout_ms < 0) {
        Curl_failf(data,"SSL shutdown timeout");
        CVar4 = CURLE_OPERATION_TIMEDOUT;
        cf_00 = local_48;
        sockindex = local_4c;
        goto LAB_0016b594;
      }
      CVar4 = (*Curl_ssl->shut_down)(cf,data,SUB41(local_3c,0),&done);
      if (CVar4 != CURLE_OK) {
LAB_0016b56f:
        *(undefined8 *)((long)cf->ctx + 0x38) = local_38;
        bVar3 = 2;
        goto LAB_0016b57e;
      }
      if (done != false) break;
      if (*(int *)((long)pvVar2 + 0xb4) != 0) {
        iVar5 = Curl_conn_cf_poll(cf,data,timeout_ms);
        if (iVar5 < 0) {
          puVar6 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar6);
          CVar4 = CURLE_RECV_ERROR;
        }
        else {
          if (iVar5 != 0) goto LAB_0016b4f6;
          Curl_failf(data,"SSL shutdown timeout");
          CVar4 = CURLE_OPERATION_TIMEDOUT;
        }
        goto LAB_0016b56f;
      }
LAB_0016b4f6:
    }
    *(undefined8 *)((long)cf->ctx + 0x38) = local_38;
    bVar3 = done * '\x02';
    CVar4 = CURLE_OK;
LAB_0016b57e:
    cf->field_0x24 = cf->field_0x24 & 0xfd | bVar3;
    cf_00 = local_48;
    sockindex = local_4c;
  }
  else {
    done = true;
  }
LAB_0016b594:
  Curl_shutdown_clear(data,sockindex);
  uVar7 = 0x50;
  if ((done & 1U) != 0) {
    uVar7 = 0;
  }
  if (CVar4 != CURLE_OK) {
    uVar7 = (ulong)CVar4;
  }
  Curl_conn_cf_discard_sub(cf_00,cf,data,false);
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, done -> %d",uVar7);
  }
  return (CURLcode)uVar7;
}

Assistant:

CURLcode Curl_ssl_cfilter_remove(struct Curl_easy *data,
                                 int sockindex, bool send_shutdown)
{
  struct Curl_cfilter *cf, *head;
  CURLcode result = CURLE_OK;

  head = data->conn ? data->conn->cfilter[sockindex] : NULL;
  for(cf = head; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl) {
      bool done;
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, start");
      Curl_shutdown_start(data, sockindex, NULL);
      result = vtls_shutdown_blocking(cf, data, send_shutdown, &done);
      Curl_shutdown_clear(data, sockindex);
      if(!result && !done) /* blocking failed? */
        result = CURLE_SSL_SHUTDOWN_FAILED;
      Curl_conn_cf_discard_sub(head, cf, data, FALSE);
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, done -> %d", result);
      break;
    }
  }
  return result;
}